

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.cpp
# Opt level: O1

String __thiscall MiniScript::Value::ToString(Value *this,Machine *vm)

{
  long *plVar1;
  size_t sVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined5 uVar5;
  StringStorage *pSVar6;
  char *pcVar7;
  long lVar8;
  StringStorage *pSVar9;
  _func_int **pp_Var10;
  _func_int *p_Var11;
  _func_int **pp_Var12;
  _func_int *p_Var13;
  undefined8 *puVar14;
  undefined4 *puVar15;
  StringStorage *pSVar16;
  StringStorage *pSVar17;
  ulong uVar18;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  String *other;
  long lVar19;
  size_t sVar20;
  ulong uVar21;
  code *__n;
  _func_int *__n_00;
  size_t sVar22;
  double dVar23;
  String SVar24;
  String s;
  String local_b0;
  StringStorage *local_a0;
  String local_98;
  size_t local_88;
  StringStorage *local_80;
  StringStorage *local_78;
  undefined8 uStack_70;
  long *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  ulong local_58;
  long local_50;
  StringStorage *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  size_t local_38;
  
  local_a0 = (StringStorage *)this;
  switch(*(undefined1 *)&vm->standardOutput) {
  case 1:
    local_78 = *(StringStorage **)&vm->storeImplicit;
    uStack_70 = 0;
    dVar23 = fmod((double)local_78,1.0);
    if ((((dVar23 == 0.0) && (!NAN(dVar23))) || (10000000000.0 < ABS((double)local_78))) ||
       (ABS((double)local_78) < 1e-06)) {
      SVar24 = String::Format((double)local_78,(char *)this);
      in_RDX = SVar24._8_8_;
      goto LAB_0018f377;
    }
    String::Format((double)local_78,(char *)this);
    lVar8 = *(long *)this;
    if (lVar8 == 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = *(long *)(lVar8 + 0x18) - 1;
    }
    lVar19 = 1;
    if ((long)(uVar21 - 1) < 1) {
      lVar19 = uVar21 - 1;
    }
    do {
      in_RDX = uVar21 - 1;
      uVar18 = lVar19 + 1;
      if (((long)in_RDX < 2) ||
         (uVar18 = uVar21, *(char *)(*(long *)(lVar8 + 0x10) + -1 + uVar21) != '0')) break;
      pcVar7 = (char *)(*(long *)(lVar8 + 0x10) + -2 + uVar21);
      uVar21 = in_RDX;
    } while (*pcVar7 != '.');
    if (lVar8 == 0) {
      uVar21 = 0;
    }
    else {
      uVar21 = *(long *)(lVar8 + 0x18) - 1;
    }
    if (uVar21 <= uVar18) goto LAB_0018f377;
    String::SubstringB(&local_b0,(long)this,0);
    String::operator=((String *)this,&local_b0);
    in_RDX = extraout_RDX_13;
    break;
  case 2:
    pSVar16 = (StringStorage *)operator_new(0x30);
    (pSVar16->super_RefCountedStorage).refCount = 1;
    (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar16->dataSize = 2;
    pSVar16->charCount = -1;
    pcVar7 = (char *)operator_new__(2);
    pSVar16->data = pcVar7;
    pcVar7[0] = '_';
    pcVar7[1] = '\0';
    SVar24 = String::Format(&local_b0,*(int *)&vm->storeImplicit,"%d");
    pSVar6 = local_b0.ss;
    in_RDX = SVar24._8_8_;
    if (local_b0.ss == (StringStorage *)0x0) {
      *(undefined1 *)&(local_a0->super_RefCountedStorage).refCount = 0;
      (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = (_func_int **)pSVar16;
      plVar1 = &(pSVar16->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
      this = (Value *)local_a0;
    }
    else {
      sVar2 = pSVar16->dataSize;
      pSVar17 = (StringStorage *)(local_b0.ss)->dataSize;
      pp_Var10 = (_func_int **)operator_new(0x30);
      p_Var13 = (_func_int *)((long)pSVar17 + (sVar2 - 1));
      pp_Var10[1] = (_func_int *)0x1;
      *pp_Var10 = (_func_int *)&PTR__StringStorage_001d10b0;
      pp_Var10[3] = p_Var13;
      pp_Var10[4] = (_func_int *)0xffffffffffffffff;
      local_78 = pSVar17;
      p_Var11 = (_func_int *)operator_new__((ulong)p_Var13);
      sVar20 = sVar2 - 1;
      pp_Var10[2] = p_Var11;
      memset(p_Var11,0,(size_t)p_Var13);
      memcpy(p_Var11,pSVar16->data,sVar20);
      memcpy(p_Var11 + sVar20,pSVar6->data,(size_t)local_78);
      this = (Value *)local_a0;
      (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = pp_Var10;
      *(undefined1 *)&(local_a0->super_RefCountedStorage).refCount = 0;
      in_RDX = extraout_RDX;
      if (local_b0.isTemp == false) {
        plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar6);
          in_RDX = extraout_RDX_04;
        }
        local_b0.ss = (StringStorage *)0x0;
      }
    }
    goto LAB_0018f319;
  case 3:
    if (*(long *)&vm->storeImplicit != 0) {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
    }
    uVar3 = vm->field_0x9;
    uVar4 = vm->field_0xa;
    uVar5 = *(undefined5 *)&vm->field_0xb;
    this->type = vm->storeImplicit;
    this->noInvoke = (bool)uVar3;
    this->localOnly = uVar4;
    *(undefined5 *)&this->field_0x3 = uVar5;
    goto LAB_0018f017;
  case 4:
  case 5:
    SVar24 = CodeForm(this,vm,(int)in_RDX);
    in_RDX = SVar24._8_8_;
    goto LAB_0018f377;
  case 6:
    local_b0.isTemp = false;
    local_58 = in_RDX;
    pSVar16 = (StringStorage *)operator_new(0x30);
    (pSVar16->super_RefCountedStorage).refCount = 1;
    (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar16->dataSize = 10;
    pSVar16->charCount = -1;
    pcVar7 = (char *)operator_new__(10);
    pSVar16->data = pcVar7;
    builtin_strncpy(pcVar7,"FUNCTION(",10);
    sVar20 = *(size_t *)&vm->storeImplicit;
    local_50 = 0;
    pSVar6 = (StringStorage *)0x0;
    local_b0.ss = pSVar16;
    local_88 = sVar20;
    while( true ) {
      if (*(long *)(sVar20 + 0x10) == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = *(long *)(*(long *)(sVar20 + 0x10) + 0x20);
      }
      if (lVar8 <= (long)pSVar6) break;
      local_78 = pSVar6;
      if (pSVar6 != (StringStorage *)0x0) {
        local_98.isTemp = false;
        pSVar16 = (StringStorage *)operator_new(0x30);
        (pSVar16->super_RefCountedStorage).refCount = 1;
        (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001d10b0;
        pSVar16->dataSize = 3;
        pSVar16->charCount = -1;
        pcVar7 = (char *)operator_new__(3);
        pSVar16->data = pcVar7;
        pcVar7[2] = '\0';
        pcVar7[0] = ',';
        pcVar7[1] = ' ';
        local_98.ss = pSVar16;
        if (local_b0.ss == (StringStorage *)0x0) {
          String::operator=(&local_b0,&local_98);
        }
        else {
          local_80 = local_b0.ss;
          sVar2 = (local_b0.ss)->dataSize;
          sVar20 = pSVar16->dataSize;
          pSVar17 = (StringStorage *)operator_new(0x30);
          uVar21 = (sVar2 + sVar20) - 1;
          (pSVar17->super_RefCountedStorage).refCount = 1;
          (pSVar17->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001d10b0;
          pSVar17->dataSize = uVar21;
          pSVar17->charCount = -1;
          pcVar7 = (char *)operator_new__(uVar21);
          sVar22 = sVar2 - 1;
          pSVar17->data = pcVar7;
          memset(pcVar7,0,uVar21);
          pSVar6 = local_80;
          memcpy(pcVar7,local_80->data,sVar22);
          memcpy(pcVar7 + sVar22,pSVar16->data,sVar20);
          sVar20 = local_88;
          if (local_b0.isTemp == false) {
            plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*(pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar6);
            }
          }
          local_b0.isTemp = false;
          local_b0.ss = pSVar17;
        }
        this = (Value *)local_a0;
        if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
          plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_98.ss = (StringStorage *)0x0;
        }
      }
      if (*(long *)(sVar20 + 0x10) == 0) {
        _Error("Assert failed: ls",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
               ,0x3b);
      }
      lVar8 = *(long *)(sVar20 + 0x10);
      if ((long)local_78 < *(long *)(lVar8 + 0x20)) {
        other = (String *)(*(long *)(lVar8 + 0x18) + local_50);
      }
      else {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        other = *(String **)(lVar8 + 0x18);
      }
      pSVar16 = other->ss;
      if (pSVar16 != (StringStorage *)0x0) {
        if (local_b0.ss == (StringStorage *)0x0) {
          String::operator=(&local_b0,other);
        }
        else {
          local_80 = local_b0.ss;
          sVar2 = (local_b0.ss)->dataSize;
          sVar20 = pSVar16->dataSize;
          pSVar17 = (StringStorage *)operator_new(0x30);
          uVar21 = (sVar2 + sVar20) - 1;
          (pSVar17->super_RefCountedStorage).refCount = 1;
          (pSVar17->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001d10b0;
          pSVar17->dataSize = uVar21;
          pSVar17->charCount = -1;
          pcVar7 = (char *)operator_new__(uVar21);
          sVar22 = sVar2 - 1;
          pSVar17->data = pcVar7;
          memset(pcVar7,0,uVar21);
          pSVar6 = local_80;
          memcpy(pcVar7,local_80->data,sVar22);
          memcpy(pcVar7 + sVar22,pSVar16->data,sVar20);
          sVar20 = local_88;
          this = (Value *)local_a0;
          if (local_b0.isTemp == false) {
            plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
            *plVar1 = *plVar1 + -1;
            if (*plVar1 == 0) {
              (*(pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar6);
            }
          }
          local_b0.isTemp = false;
          local_b0.ss = pSVar17;
        }
      }
      if (*(long *)(sVar20 + 0x10) == 0) {
        _Error("Assert failed: ls",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
               ,0x3b);
      }
      lVar8 = *(long *)(sVar20 + 0x10);
      if ((long)local_78 < *(long *)(lVar8 + 0x20)) {
        lVar8 = *(long *)(lVar8 + 0x18) + local_50;
      }
      else {
        _Error("invalid index in SimpleVector::operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
               ,0xc1);
        lVar8 = *(long *)(lVar8 + 0x18);
      }
      pSVar16 = local_78;
      if (*(char *)(lVar8 + 0x10) != '\0') {
        pSVar6 = (StringStorage *)operator_new(0x30);
        (pSVar6->super_RefCountedStorage).refCount = 1;
        (pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001d10b0;
        pSVar6->dataSize = 2;
        pSVar6->charCount = -1;
        pcVar7 = (char *)operator_new__(2);
        uVar21 = local_58;
        pSVar6->data = pcVar7;
        pcVar7[0] = '=';
        pcVar7[1] = '\0';
        local_80 = pSVar6;
        if (*(long *)(local_88 + 0x10) == 0) {
          _Error("Assert failed: ls",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                 ,0x3b);
        }
        lVar8 = *(long *)(local_88 + 0x10);
        if ((long)pSVar16 < *(long *)(lVar8 + 0x20)) {
          lVar8 = *(long *)(lVar8 + 0x18) + local_50;
        }
        else {
          _Error("invalid index in SimpleVector::operator[]",
                 "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                 ,0xc1);
          lVar8 = *(long *)(lVar8 + 0x18);
        }
        CodeForm((Value *)&local_68,(Machine *)(lVar8 + 0x10),(int)uVar21);
        plVar1 = local_68;
        if (local_68 == (long *)0x0) {
          plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + 1;
          local_98.ss = pSVar6;
        }
        else {
          sVar2 = pSVar6->dataSize;
          sVar20 = local_68[3];
          pSVar6 = (StringStorage *)operator_new(0x30);
          uVar21 = (sVar2 + sVar20) - 1;
          (pSVar6->super_RefCountedStorage).refCount = 1;
          (pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
               (_func_int **)&PTR__StringStorage_001d10b0;
          pSVar6->dataSize = uVar21;
          pSVar6->charCount = -1;
          pcVar7 = (char *)operator_new__(uVar21);
          sVar22 = sVar2 - 1;
          pSVar6->data = pcVar7;
          memset(pcVar7,0,uVar21);
          memcpy(pcVar7,local_80->data,sVar22);
          memcpy(pcVar7 + sVar22,(void *)plVar1[2],sVar20);
          pSVar16 = local_78;
          local_98.ss = pSVar6;
        }
        sVar20 = local_88;
        pSVar17 = local_98.ss;
        pSVar6 = local_b0.ss;
        local_98.isTemp = false;
        if (local_98.ss != (StringStorage *)0x0) {
          if (local_b0.ss == (StringStorage *)0x0) {
            String::operator=(&local_b0,&local_98);
          }
          else {
            sVar2 = (local_b0.ss)->dataSize;
            sVar20 = (local_98.ss)->dataSize;
            pSVar9 = (StringStorage *)operator_new(0x30);
            uVar21 = (sVar2 + sVar20) - 1;
            (pSVar9->super_RefCountedStorage).refCount = 1;
            (pSVar9->super_RefCountedStorage)._vptr_RefCountedStorage =
                 (_func_int **)&PTR__StringStorage_001d10b0;
            pSVar9->dataSize = uVar21;
            pSVar9->charCount = -1;
            local_38 = sVar20;
            pcVar7 = (char *)operator_new__(uVar21);
            sVar20 = sVar2 - 1;
            pSVar9->data = pcVar7;
            memset(pcVar7,0,uVar21);
            memcpy(pcVar7,pSVar6->data,sVar20);
            memcpy(pcVar7 + sVar20,pSVar17->data,local_38);
            pSVar16 = local_78;
            sVar20 = local_88;
            if (local_b0.isTemp == false) {
              plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
              *plVar1 = *plVar1 + -1;
              if (*plVar1 == 0) {
                (*(pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar6);
              }
            }
            local_b0.isTemp = false;
            local_b0.ss = pSVar9;
          }
        }
        pSVar6 = local_80;
        this = (Value *)local_a0;
        if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
          plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_98.ss = (StringStorage *)0x0;
        }
        if ((local_68 != (long *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
          plVar1 = local_68 + 1;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (**(code **)(*local_68 + 8))();
          }
          local_68 = (long *)0x0;
        }
        plVar1 = &(pSVar6->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*(pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar6);
        }
      }
      pSVar6 = (StringStorage *)
               ((long)&(pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage + 1);
      local_50 = local_50 + 0x20;
    }
    SVar24 = String::operator+((String *)this,(char *)&local_b0);
    in_RDX = SVar24._8_8_;
    break;
  case 7:
    if (*(long *)&vm->storeImplicit != 0) {
      plVar1 = (long *)(*(long *)&vm->storeImplicit + 8);
      *plVar1 = *plVar1 + 1;
    }
    pSVar16 = *(StringStorage **)&vm->storeImplicit;
    if (*(char *)((long)&vm->standardOutput + 1) == '\x01') {
      pp_Var10 = (_func_int **)operator_new(0x30);
      pp_Var10[1] = (_func_int *)0x1;
      *pp_Var10 = (_func_int *)&PTR__StringStorage_001d10b0;
      pp_Var10[3] = (_func_int *)0x2;
      pp_Var10[4] = (_func_int *)0xffffffffffffffff;
      p_Var11 = (_func_int *)operator_new__(2);
      pp_Var10[2] = p_Var11;
      *(undefined2 *)p_Var11 = 0x40;
      if (pSVar16 == (StringStorage *)0x0) {
        *(undefined1 *)&(local_a0->super_RefCountedStorage).refCount = 0;
        (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = pp_Var10;
        pp_Var10[1] = pp_Var10[1] + 1;
        in_RDX = extraout_RDX_00;
      }
      else {
        p_Var11 = pp_Var10[3];
        pSVar6 = (StringStorage *)pSVar16->dataSize;
        pp_Var12 = (_func_int **)operator_new(0x30);
        __n_00 = p_Var11 + -1 + (long)&pSVar6->super_RefCountedStorage;
        pp_Var12[1] = (_func_int *)0x1;
        *pp_Var12 = (_func_int *)&PTR__StringStorage_001d10b0;
        pp_Var12[3] = __n_00;
        pp_Var12[4] = (_func_int *)0xffffffffffffffff;
        local_78 = pSVar6;
        p_Var13 = (_func_int *)operator_new__((ulong)__n_00);
        __n = p_Var11 + -1;
        pp_Var12[2] = p_Var13;
        memset(p_Var13,0,(size_t)__n_00);
        memcpy(p_Var13,pp_Var10[2],(size_t)__n);
        memcpy(__n + (long)p_Var13,pSVar16->data,(size_t)local_78);
        (local_a0->super_RefCountedStorage)._vptr_RefCountedStorage = pp_Var12;
        *(undefined1 *)&(local_a0->super_RefCountedStorage).refCount = 0;
        in_RDX = extraout_RDX_01;
      }
      this = (Value *)local_a0;
      pp_Var12 = pp_Var10 + 1;
      *pp_Var12 = *pp_Var12 + -1;
      if (*pp_Var12 == (_func_int *)0x0) {
        (**(code **)(*pp_Var10 + 8))(pp_Var10);
        in_RDX = extraout_RDX_09;
      }
    }
    else {
      *(undefined1 *)&this->data = 0;
      *(StringStorage **)this = pSVar16;
      if (pSVar16 == (StringStorage *)0x0) goto LAB_0018f377;
      plVar1 = &(pSVar16->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    if (pSVar16 == (StringStorage *)0x0) goto LAB_0018f377;
LAB_0018f319:
    plVar1 = &(pSVar16->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      pp_Var10 = (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage;
LAB_0018f374:
      (*pp_Var10[1])(pSVar16);
      in_RDX = extraout_RDX_12;
    }
    goto LAB_0018f377;
  case 8:
    lVar8 = *(long *)&vm->storeImplicit;
    ToString((Value *)&local_68,(Machine *)(lVar8 + 0x10));
    String::operator+(&local_98,(char *)&local_68);
    ToString((Value *)&local_48,(Machine *)(lVar8 + 0x20));
    pSVar16 = local_48;
    if (local_48 == (StringStorage *)0x0) {
      local_b0.ss = local_98.ss;
      if (local_98.ss != (StringStorage *)0x0) {
        plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + 1;
      }
    }
    else if (local_98.ss == (StringStorage *)0x0) {
      local_b0.ss = local_48;
      plVar1 = &(local_48->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
    }
    else {
      local_78 = local_98.ss;
      sVar2 = (local_98.ss)->dataSize;
      sVar20 = local_48->dataSize;
      pSVar6 = (StringStorage *)operator_new(0x30);
      uVar21 = (sVar20 + sVar2) - 1;
      (pSVar6->super_RefCountedStorage).refCount = 1;
      (pSVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001d10b0;
      pSVar6->dataSize = uVar21;
      pSVar6->charCount = -1;
      local_88 = sVar20;
      pcVar7 = (char *)operator_new__(uVar21);
      sVar20 = sVar2 - 1;
      pSVar6->data = pcVar7;
      memset(pcVar7,0,uVar21);
      memcpy(pcVar7,local_78->data,sVar20);
      memcpy(pcVar7 + sVar20,pSVar16->data,local_88);
      this = (Value *)local_a0;
      local_b0.ss = pSVar6;
    }
    local_b0.isTemp = false;
    SVar24 = String::operator+((String *)this,(char *)&local_b0);
    in_RDX = SVar24._8_8_;
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_05;
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    if ((local_48 != (StringStorage *)0x0) && (local_40.tempNum._0_1_ == '\0')) {
      plVar1 = &(local_48->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_48->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_06;
      }
      local_48 = (StringStorage *)0x0;
    }
    if ((local_98.ss != (StringStorage *)0x0) && (local_98.isTemp == false)) {
      plVar1 = &((local_98.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_98.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_07;
      }
      local_98.ss = (StringStorage *)0x0;
    }
    if ((local_68 != (long *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
      plVar1 = local_68 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*local_68 + 8))();
        in_RDX = extraout_RDX_08;
      }
      local_68 = (long *)0x0;
    }
    if (*(char *)((long)&vm->standardOutput + 1) != '\x01') goto LAB_0018f377;
    pSVar16 = (StringStorage *)operator_new(0x30);
    (pSVar16->super_RefCountedStorage).refCount = 1;
    (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar16->dataSize = 2;
    pSVar16->charCount = -1;
    pcVar7 = (char *)operator_new__(2);
    pSVar16->data = pcVar7;
    pcVar7[0] = '@';
    pcVar7[1] = '\0';
    pp_Var10 = (((StringStorage *)this)->super_RefCountedStorage)._vptr_RefCountedStorage;
    if (pp_Var10 == (_func_int **)0x0) {
      plVar1 = &(pSVar16->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + 1;
      local_b0.ss = pSVar16;
    }
    else {
      sVar2 = pSVar16->dataSize;
      pSVar6 = (StringStorage *)pp_Var10[3];
      pSVar17 = (StringStorage *)operator_new(0x30);
      uVar21 = (long)pSVar6 + (sVar2 - 1);
      (pSVar17->super_RefCountedStorage).refCount = 1;
      (pSVar17->super_RefCountedStorage)._vptr_RefCountedStorage =
           (_func_int **)&PTR__StringStorage_001d10b0;
      pSVar17->dataSize = uVar21;
      pSVar17->charCount = -1;
      local_78 = pSVar6;
      pcVar7 = (char *)operator_new__(uVar21);
      sVar20 = sVar2 - 1;
      pSVar17->data = pcVar7;
      memset(pcVar7,0,uVar21);
      memcpy(pcVar7,pSVar16->data,sVar20);
      memcpy(pcVar7 + sVar20,pp_Var10[2],(size_t)local_78);
      this = (Value *)local_a0;
      local_b0.ss = pSVar17;
    }
    local_b0.isTemp = false;
    String::operator=((String *)this,&local_b0);
    in_RDX = extraout_RDX_10;
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_11;
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    plVar1 = &(pSVar16->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 != 0) goto LAB_0018f377;
    pp_Var10 = (pSVar16->super_RefCountedStorage)._vptr_RefCountedStorage;
    goto LAB_0018f374;
  case 9:
    *(undefined1 *)&this->data = 0;
    puVar14 = (undefined8 *)operator_new(0x30);
    puVar14[1] = 1;
    *puVar14 = &PTR__StringStorage_001d10b0;
    puVar14[3] = 7;
    puVar14[4] = 0xffffffffffffffff;
    puVar15 = (undefined4 *)operator_new__(7);
    puVar14[2] = puVar15;
    *(undefined8 **)this = puVar14;
    *(undefined4 *)((long)puVar15 + 3) = 0x656c64;
    *puVar15 = 0x646e6148;
    in_RDX = extraout_RDX_02;
    goto LAB_0018f377;
  default:
    this->type = Null;
    this->noInvoke = false;
    this->localOnly = Off;
    *(undefined5 *)&this->field_0x3 = 0;
LAB_0018f017:
    *(undefined1 *)&this->data = 0;
    goto LAB_0018f377;
  }
  if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
    plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      in_RDX = extraout_RDX_03;
    }
  }
LAB_0018f377:
  SVar24._8_8_ = in_RDX;
  SVar24.ss = (StringStorage *)this;
  return SVar24;
}

Assistant:

String Value::ToString(Machine *vm) {
		if (type == ValueType::Number) {
			// Convert number to string in the standard Miniscript way.
			double value = data.number;
			if (fmod(value, 1.0) == 0.0) {
				return String::Format(value, "%.0f");
			} else if (value > 1E10 || value < -1E10 || (value < 1E-6 && value > -1E-6)) {
				// very large/small numbers in exponential form
				return String::Format(value, "%.6E");
			} else {
				// all others in decimal form, with 1-6 digits past the decimal point
				String s = String::Format(value, "%.6f");
				long i = s.LengthB() - 1;
				while (i > 1 && s[i] == '0' && s[i-1] != '.') i--;
				if (i+1 < s.LengthB()) s = s.SubstringB(0, i+1);
				return s;
			}
		}
		if (type == ValueType::String) { retain(); return String((StringStorage*)data.ref, false); }
		if (type == ValueType::List) return CodeForm(vm, 3);
		if (type == ValueType::Map) return CodeForm(vm, 3);
		if (type == ValueType::Var) {
			retain();
			String ident((StringStorage*)data.ref, false);
			if (noInvoke) return String("@") + ident;
			return ident;
		}
		if (type == ValueType::Temp) return String("_") + String::Format((int)data.tempNum);
		if (type == ValueType::Function) {
			String s("FUNCTION(");
			FunctionStorage *fs = (FunctionStorage*)data.ref;
			for (long i=0; i < fs->parameters.Count(); i++) {
				if (i > 0) s += ", ";
				s += fs->parameters[i].name;
				if (not fs->parameters[i].defaultValue.IsNull()) s += String("=") + fs->parameters[i].defaultValue.CodeForm(vm);
			}
			return s + ")";
		}
		if (type == ValueType::SeqElem) {
			SeqElemStorage *se = (SeqElemStorage*)data.ref;
			String s = se->sequence.ToString(vm) + "[" + se->index.ToString(vm) + "]";
			if (noInvoke) s = String("@") + s;
			return s;
		}
		if (type == ValueType::Handle) {
			return "Handle";
		}
		return String();
	}